

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ssse3.c
# Opt level: O0

void fill_block(__m128i *state,block *ref_block,block *next_block,int with_xor)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined1 (*pauVar3) [16];
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong *puVar27;
  undefined8 *puVar28;
  long *plVar29;
  ulong *puVar30;
  int in_ECX;
  undefined8 *puVar31;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  undefined8 extraout_XMM0_Qa_19;
  undefined8 extraout_XMM0_Qa_20;
  undefined8 extraout_XMM0_Qa_21;
  undefined8 extraout_XMM0_Qa_22;
  undefined8 extraout_XMM0_Qa_23;
  undefined8 extraout_XMM0_Qa_24;
  undefined8 extraout_XMM0_Qa_25;
  undefined8 extraout_XMM0_Qa_26;
  undefined8 extraout_XMM0_Qa_27;
  undefined8 extraout_XMM0_Qa_28;
  undefined8 extraout_XMM0_Qa_29;
  undefined8 extraout_XMM0_Qa_30;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined8 extraout_XMM0_Qb_10;
  undefined8 extraout_XMM0_Qb_11;
  undefined8 extraout_XMM0_Qb_12;
  undefined8 extraout_XMM0_Qb_13;
  undefined8 extraout_XMM0_Qb_14;
  undefined8 extraout_XMM0_Qb_15;
  undefined8 extraout_XMM0_Qb_16;
  undefined8 extraout_XMM0_Qb_17;
  undefined8 extraout_XMM0_Qb_18;
  undefined8 extraout_XMM0_Qb_19;
  undefined8 extraout_XMM0_Qb_20;
  undefined8 extraout_XMM0_Qb_21;
  undefined8 extraout_XMM0_Qb_22;
  undefined8 extraout_XMM0_Qb_23;
  undefined8 extraout_XMM0_Qb_24;
  undefined8 extraout_XMM0_Qb_25;
  undefined8 extraout_XMM0_Qb_26;
  undefined8 extraout_XMM0_Qb_27;
  undefined8 extraout_XMM0_Qb_28;
  undefined8 extraout_XMM0_Qb_29;
  undefined8 extraout_XMM0_Qb_30;
  __m128i y;
  __m128i y_00;
  __m128i y_01;
  __m128i y_02;
  __m128i y_03;
  __m128i y_04;
  __m128i y_05;
  __m128i y_06;
  __m128i y_07;
  __m128i y_08;
  __m128i y_09;
  __m128i y_10;
  __m128i y_11;
  __m128i y_12;
  __m128i y_13;
  __m128i y_14;
  __m128i y_15;
  __m128i y_16;
  __m128i y_17;
  __m128i y_18;
  __m128i y_19;
  __m128i y_20;
  __m128i y_21;
  __m128i y_22;
  __m128i y_23;
  __m128i y_24;
  __m128i y_25;
  __m128i y_26;
  __m128i y_27;
  __m128i y_28;
  __m128i y_29;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  __m128i x_05;
  __m128i x_06;
  __m128i x_07;
  __m128i x_08;
  __m128i x_09;
  __m128i x_10;
  __m128i x_11;
  __m128i x_12;
  __m128i x_13;
  __m128i x_14;
  __m128i x_15;
  __m128i x_16;
  __m128i x_17;
  __m128i x_18;
  __m128i x_19;
  __m128i x_20;
  __m128i x_21;
  __m128i x_22;
  __m128i x_23;
  __m128i x_24;
  __m128i x_25;
  __m128i x_26;
  __m128i x_27;
  __m128i x_28;
  __m128i x_29;
  __m128i alVar33;
  __m128i alVar34;
  __m128i t1_3;
  __m128i t0_3;
  __m128i t1_2;
  __m128i t0_2;
  __m128i t1_1;
  __m128i t0_1;
  __m128i t1;
  __m128i t0;
  uint i;
  __m128i block_XY [64];
  undefined8 local_11a8;
  undefined8 local_1188;
  undefined8 local_1168;
  undefined8 local_1148;
  uint local_111c;
  ulong local_1118 [129];
  long local_d10;
  long local_d00;
  ulong local_cd8;
  ulong uStack_cd0;
  ulong local_cc8;
  ulong uStack_cc0;
  ulong local_cb8;
  ulong uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  ulong local_c98;
  ulong uStack_c90;
  ulong local_c88;
  ulong uStack_c80;
  ulong local_c78;
  ulong uStack_c70;
  ulong local_c68;
  ulong uStack_c60;
  ulong local_c58;
  ulong uStack_c50;
  ulong local_c48;
  ulong uStack_c40;
  ulong local_c38;
  ulong uStack_c30;
  ulong local_c28;
  ulong uStack_c20;
  ulong local_c18;
  ulong uStack_c10;
  ulong local_c08;
  ulong uStack_c00;
  ulong local_bf8;
  ulong uStack_bf0;
  ulong local_be8;
  ulong uStack_be0;
  ulong local_bd8;
  ulong uStack_bd0;
  ulong local_bc8;
  ulong uStack_bc0;
  ulong local_bb8;
  ulong uStack_bb0;
  ulong local_ba8;
  ulong uStack_ba0;
  ulong local_b98;
  ulong uStack_b90;
  ulong local_b88;
  ulong uStack_b80;
  ulong local_b78;
  ulong uStack_b70;
  ulong local_b68;
  ulong uStack_b60;
  ulong local_b58;
  ulong uStack_b50;
  ulong local_b48;
  ulong uStack_b40;
  ulong local_b38;
  ulong uStack_b30;
  ulong local_b28;
  ulong uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  ulong local_b08;
  ulong uStack_b00;
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  ulong local_ad8;
  ulong uStack_ad0;
  ulong local_ac8;
  ulong uStack_ac0;
  ulong local_ab8;
  ulong uStack_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong local_a98;
  ulong uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  ulong local_a78;
  ulong uStack_a70;
  ulong local_a68;
  ulong uStack_a60;
  ulong local_a58;
  ulong uStack_a50;
  ulong local_a48;
  ulong uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  ulong local_a18;
  ulong uStack_a10;
  ulong local_a08;
  ulong uStack_a00;
  ulong local_9f8;
  ulong uStack_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong local_9d8;
  ulong uStack_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong local_9b8;
  ulong uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  ulong local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  ulong local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  ulong local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  ulong local_838;
  ulong uStack_830;
  ulong local_828;
  ulong uStack_820;
  ulong local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  ulong local_798;
  ulong uStack_790;
  ulong local_788;
  ulong uStack_780;
  ulong *local_770;
  ulong *local_768;
  ulong *local_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined1 local_54c;
  undefined1 local_54b;
  undefined1 local_54a;
  undefined1 local_549;
  undefined1 local_548;
  undefined1 local_547;
  undefined1 local_546;
  undefined1 local_545;
  undefined1 local_544;
  undefined1 local_543;
  undefined1 local_542;
  undefined1 local_541;
  undefined1 local_540;
  undefined1 local_53f;
  undefined1 local_53e;
  undefined1 local_53d;
  undefined1 local_53c;
  undefined1 local_53b;
  undefined1 local_53a;
  undefined1 local_539;
  undefined1 local_538;
  undefined1 local_537;
  undefined1 local_536;
  undefined1 local_535;
  undefined1 local_534;
  undefined1 local_533;
  undefined1 local_532;
  undefined1 local_531;
  undefined1 local_530;
  undefined1 local_52f;
  undefined1 local_52e;
  undefined1 local_52d;
  undefined1 local_52c;
  undefined1 local_52b;
  undefined1 local_52a;
  undefined1 local_529;
  undefined1 local_528;
  undefined1 local_527;
  undefined1 local_526;
  undefined1 local_525;
  undefined1 local_524;
  undefined1 local_523;
  undefined1 local_522;
  undefined1 local_521;
  undefined1 local_520;
  undefined1 local_51f;
  undefined1 local_51e;
  undefined1 local_51d;
  undefined1 local_51c;
  undefined1 local_51b;
  undefined1 local_51a;
  undefined1 local_519;
  undefined1 local_518;
  undefined1 local_517;
  undefined1 local_516;
  undefined1 local_515;
  undefined1 local_514;
  undefined1 local_513;
  undefined1 local_512;
  undefined1 local_511;
  undefined1 local_510;
  undefined1 local_50f;
  undefined1 local_50e;
  undefined1 local_50d;
  undefined1 local_50c;
  undefined1 local_50b;
  undefined1 local_50a;
  undefined1 local_509;
  undefined1 local_508;
  undefined1 local_507;
  undefined1 local_506;
  undefined1 local_505;
  undefined1 local_504;
  undefined1 local_503;
  undefined1 local_502;
  undefined1 local_501;
  undefined1 local_500;
  undefined1 local_4ff;
  undefined1 local_4fe;
  undefined1 local_4fd;
  undefined1 local_4fc;
  undefined1 local_4fb;
  undefined1 local_4fa;
  undefined1 local_4f9;
  undefined1 local_4f8;
  undefined1 local_4f7;
  undefined1 local_4f6;
  undefined1 local_4f5;
  undefined1 local_4f4;
  undefined1 local_4f3;
  undefined1 local_4f2;
  undefined1 local_4f1;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_4ee;
  undefined1 local_4ed;
  undefined1 local_4ec;
  undefined1 local_4eb;
  undefined1 local_4ea;
  undefined1 local_4e9;
  undefined1 local_4e8;
  undefined1 local_4e7;
  undefined1 local_4e6;
  undefined1 local_4e5;
  undefined1 local_4e4;
  undefined1 local_4e3;
  undefined1 local_4e2;
  undefined1 local_4e1;
  undefined1 local_4e0;
  undefined1 local_4df;
  undefined1 local_4de;
  undefined1 local_4dd;
  undefined1 local_4dc;
  undefined1 local_4db;
  undefined1 local_4da;
  undefined1 local_4d9;
  undefined1 local_4d8;
  undefined1 local_4d7;
  undefined1 local_4d6;
  undefined1 local_4d5;
  undefined1 local_4d4;
  undefined1 local_4d3;
  undefined1 local_4d2;
  undefined1 local_4d1;
  undefined1 local_4d0;
  undefined1 local_4cf;
  undefined1 local_4ce;
  undefined1 local_4cd;
  undefined1 local_4cc;
  undefined1 local_4cb;
  undefined1 local_4ca;
  undefined1 local_4c9;
  undefined1 local_4c8;
  undefined1 local_4c7;
  undefined1 local_4c6;
  undefined1 local_4c5;
  undefined1 local_4c4;
  undefined1 local_4c3;
  undefined1 local_4c2;
  undefined1 local_4c1;
  undefined1 local_4c0;
  undefined1 local_4bf;
  undefined1 local_4be;
  undefined1 local_4bd;
  undefined1 local_4bc;
  undefined1 local_4bb;
  undefined1 local_4ba;
  undefined1 local_4b9;
  undefined1 local_4b8;
  undefined1 local_4b7;
  undefined1 local_4b6;
  undefined1 local_4b5;
  undefined1 local_4b4;
  undefined1 local_4b3;
  undefined1 local_4b2;
  undefined1 local_4b1;
  undefined1 local_4b0;
  undefined1 local_4af;
  undefined1 local_4ae;
  undefined1 local_4ad;
  undefined1 local_4ac;
  undefined1 local_4ab;
  undefined1 local_4aa;
  undefined1 local_4a9;
  undefined1 local_4a8;
  undefined1 local_4a7;
  undefined1 local_4a6;
  undefined1 local_4a5;
  undefined1 local_4a4;
  undefined1 local_4a3;
  undefined1 local_4a2;
  undefined1 local_4a1;
  undefined1 local_4a0;
  undefined1 local_49f;
  undefined1 local_49e;
  undefined1 local_49d;
  undefined1 local_49c;
  undefined1 local_49b;
  undefined1 local_49a;
  undefined1 local_499;
  undefined1 local_498;
  undefined1 local_497;
  undefined1 local_496;
  undefined1 local_495;
  undefined1 local_494;
  undefined1 local_493;
  undefined1 local_492;
  undefined1 local_491;
  undefined1 local_490;
  undefined1 local_48f;
  undefined1 local_48e;
  undefined1 local_48d;
  undefined1 local_48c;
  undefined1 local_48b;
  undefined1 local_48a;
  undefined1 local_489;
  undefined1 local_488;
  undefined1 local_487;
  undefined1 local_486;
  undefined1 local_485;
  undefined1 local_484;
  undefined1 local_483;
  undefined1 local_482;
  undefined1 local_481;
  undefined1 local_480;
  undefined1 local_47f;
  undefined1 local_47e;
  undefined1 local_47d;
  undefined1 local_47c;
  undefined1 local_47b;
  undefined1 local_47a;
  undefined1 local_479;
  undefined1 local_478;
  undefined1 local_477;
  undefined1 local_476;
  undefined1 local_475;
  undefined1 local_474;
  undefined1 local_473;
  undefined1 local_472;
  undefined1 local_471;
  undefined1 local_470;
  undefined1 local_46f;
  undefined1 local_46e;
  undefined1 local_46d;
  undefined1 local_46c;
  undefined1 local_46b;
  undefined1 local_46a;
  undefined1 local_469;
  undefined1 local_468;
  undefined1 local_467;
  undefined1 local_466;
  undefined1 local_465;
  undefined1 local_464;
  undefined1 local_463;
  undefined1 local_462;
  undefined1 local_461;
  undefined1 local_460;
  undefined1 local_45f;
  undefined1 local_45e;
  undefined1 local_45d;
  undefined1 local_45c;
  undefined1 local_45b;
  undefined1 local_45a;
  undefined1 local_459;
  undefined1 local_458;
  undefined1 local_457;
  undefined1 local_456;
  undefined1 local_455;
  undefined1 local_454;
  undefined1 local_453;
  undefined1 local_452;
  undefined1 local_451;
  undefined1 local_450;
  undefined1 local_44f;
  undefined1 local_44e;
  undefined1 local_44d;
  undefined4 local_44c;
  ulong local_448;
  ulong uStack_440;
  undefined4 local_42c;
  ulong local_428;
  ulong uStack_420;
  undefined4 local_40c;
  ulong local_408;
  ulong uStack_400;
  undefined4 local_3ec;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined4 local_3cc;
  ulong local_3c8;
  ulong uStack_3c0;
  undefined4 local_3ac;
  ulong local_3a8;
  ulong uStack_3a0;
  undefined4 local_38c;
  ulong local_388;
  ulong uStack_380;
  undefined4 local_36c;
  ulong local_368;
  ulong uStack_360;
  long local_358;
  long lStack_350;
  long local_348;
  long lStack_340;
  long local_338;
  long lStack_330;
  long local_328;
  long lStack_320;
  long local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  long local_2f8;
  long lStack_2f0;
  long local_2e8;
  long lStack_2e0;
  long local_2d8;
  long lStack_2d0;
  long local_2c8;
  long lStack_2c0;
  long local_2b8;
  long lStack_2b0;
  long local_2a8;
  long lStack_2a0;
  long local_298;
  long lStack_290;
  long local_288;
  long lStack_280;
  long local_278;
  long lStack_270;
  long local_268;
  long lStack_260;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined1 local_228;
  undefined1 local_227;
  undefined1 local_226;
  undefined1 local_225;
  undefined1 local_224;
  undefined1 local_223;
  undefined1 local_222;
  undefined1 local_221;
  undefined1 local_220;
  undefined1 local_21f;
  undefined1 local_21e;
  undefined1 local_21d;
  undefined1 local_21c;
  undefined1 local_21b;
  undefined1 local_21a;
  undefined1 local_219;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208;
  undefined1 local_207;
  undefined1 local_206;
  undefined1 local_205;
  undefined1 local_204;
  undefined1 local_203;
  undefined1 local_202;
  undefined1 local_201;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined1 local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8;
  undefined1 local_1c7;
  undefined1 local_1c6;
  undefined1 local_1c5;
  undefined1 local_1c4;
  undefined1 local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  undefined1 local_1c0;
  undefined1 local_1bf;
  undefined1 local_1be;
  undefined1 local_1bd;
  undefined1 local_1bc;
  undefined1 local_1bb;
  undefined1 local_1ba;
  undefined1 local_1b9;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined1 local_19c;
  undefined1 local_19b;
  undefined1 local_19a;
  undefined1 local_199;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188;
  undefined1 local_187;
  undefined1 local_186;
  undefined1 local_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined1 local_182;
  undefined1 local_181;
  undefined1 local_180;
  undefined1 local_17f;
  undefined1 local_17e;
  undefined1 local_17d;
  undefined1 local_17c;
  undefined1 local_17b;
  undefined1 local_17a;
  undefined1 local_179;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_166;
  undefined1 local_165;
  undefined1 local_164;
  undefined1 local_163;
  undefined1 local_162;
  undefined1 local_161;
  undefined1 local_160;
  undefined1 local_15f;
  undefined1 local_15e;
  undefined1 local_15d;
  undefined1 local_15c;
  undefined1 local_15b;
  undefined1 local_15a;
  undefined1 local_159;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148;
  undefined1 local_147;
  undefined1 local_146;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  undefined1 local_142;
  undefined1 local_141;
  undefined1 local_140;
  undefined1 local_13f;
  undefined1 local_13e;
  undefined1 local_13d;
  undefined1 local_13c;
  undefined1 local_13b;
  undefined1 local_13a;
  undefined1 local_139;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128;
  undefined1 local_127;
  undefined1 local_126;
  undefined1 local_125;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  undefined1 local_120;
  undefined1 local_11f;
  undefined1 local_11e;
  undefined1 local_11d;
  undefined1 local_11c;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  undefined1 local_f9;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined1 local_bc;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  if (in_ECX == 0) {
    for (local_111c = 0; local_111c < 0x40; local_111c = local_111c + 1) {
      puVar27 = (ulong *)(in_RDI + (ulong)local_111c * 0x10);
      local_7c8 = *puVar27;
      uStack_7c0 = puVar27[1];
      local_770 = (ulong *)(in_RSI + (ulong)local_111c * 0x10);
      local_7d8 = *local_770;
      uStack_7d0 = local_770[1];
      puVar27 = (ulong *)(in_RDI + (ulong)local_111c * 0x10);
      *puVar27 = local_7c8 ^ local_7d8;
      puVar27[1] = uStack_7c0 ^ uStack_7d0;
      local_1118[(ulong)local_111c * 2] = local_7c8 ^ local_7d8;
      local_1118[(ulong)local_111c * 2 + 1] = uStack_7c0 ^ uStack_7d0;
    }
  }
  else {
    for (local_111c = 0; local_111c < 0x40; local_111c = local_111c + 1) {
      puVar27 = (ulong *)(in_RDI + (ulong)local_111c * 0x10);
      local_788 = *puVar27;
      uStack_780 = puVar27[1];
      local_760 = (ulong *)(in_RSI + (ulong)local_111c * 0x10);
      local_798 = *local_760;
      uStack_790 = local_760[1];
      puVar27 = (ulong *)(in_RDI + (ulong)local_111c * 0x10);
      *puVar27 = local_788 ^ local_798;
      puVar27[1] = uStack_780 ^ uStack_790;
      puVar27 = (ulong *)(in_RDI + (ulong)local_111c * 0x10);
      local_7a8 = *puVar27;
      uStack_7a0 = puVar27[1];
      local_768 = (ulong *)(in_RDX + (ulong)local_111c * 0x10);
      local_7b8 = *local_768;
      uStack_7b0 = local_768[1];
      local_1118[(ulong)local_111c * 2] = local_7a8 ^ local_7b8;
      local_1118[(ulong)local_111c * 2 + 1] = uStack_7a0 ^ uStack_7b0;
    }
  }
  alVar34[1] = in_RSI;
  alVar34[0] = in_RDI;
  local_d10 = in_RDX;
  local_d00 = in_RDI;
  for (local_111c = 0; local_111c < 8; local_111c = local_111c + 1) {
    alVar33[1] = (ulong)(local_111c << 3) * 0x10;
    alVar33[0] = in_RDX;
    x[1] = alVar34[1];
    x[0] = alVar34[0];
    alVar33 = fBlaMka(x,alVar33);
    y[0] = alVar33[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa;
    puVar28[1] = extraout_XMM0_Qb;
    y[1] = (ulong)(local_111c << 3) * 0x10;
    x_00[1] = alVar34[1];
    x_00[0] = alVar34[0];
    alVar33 = fBlaMka(x_00,y);
    y_00[0] = alVar33[1];
    puVar28 = (undefined8 *)(local_d00 + 0x10 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_00;
    puVar28[1] = extraout_XMM0_Qb_00;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + x_13[1]);
    local_7f8 = *puVar27;
    uStack_7f0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + x_13[1]);
    local_7e8 = *puVar27;
    uStack_7e0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_7e8 ^ local_7f8;
    puVar27[1] = uStack_7e0 ^ uStack_7f0;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x10 + x_13[1]);
    local_818 = *puVar27;
    uStack_810 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + x_13[1]);
    local_808 = *puVar27;
    uStack_800 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_808 ^ local_818;
    puVar27[1] = uStack_800 ^ uStack_810;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + 0x60 + x_13[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + 0x60 + x_13[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + 0x70 + x_13[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + 0x70 + x_13[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    y_00[1] = (ulong)(local_111c << 3) * 0x10;
    x_01[1] = alVar34[1];
    x_01[0] = alVar34[0];
    alVar33 = fBlaMka(x_01,y_00);
    y_01[0] = alVar33[1];
    puVar28 = (undefined8 *)(local_d00 + 0x40 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_01;
    puVar28[1] = extraout_XMM0_Qb_01;
    y_01[1] = (ulong)(local_111c << 3) * 0x10;
    x_02[1] = alVar34[1];
    x_02[0] = alVar34[0];
    alVar33 = fBlaMka(x_02,y_01);
    puVar28 = (undefined8 *)(local_d00 + 0x50 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_02;
    puVar28[1] = extraout_XMM0_Qb_02;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x20 + x_13[1]);
    local_828 = *puVar27;
    uStack_820 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x40 + x_13[1]);
    local_838 = *puVar27;
    uStack_830 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_828 ^ local_838;
    puVar27[1] = uStack_820 ^ uStack_830;
    x_13[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x30 + x_13[1]);
    local_848 = *puVar27;
    uStack_840 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x50 + x_13[1]);
    local_858 = *puVar27;
    uStack_850 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_848 ^ local_858;
    puVar27[1] = uStack_840 ^ uStack_850;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    local_568 = *(undefined8 *)*pauVar3;
    uStack_560 = *(undefined8 *)(*pauVar3 + 8);
    local_44d = 3;
    local_44e = 4;
    local_44f = 5;
    local_450 = 6;
    local_451 = 7;
    local_452 = 0;
    local_453 = 1;
    local_454 = 2;
    local_455 = 0xb;
    local_456 = 0xc;
    local_457 = 0xd;
    local_458 = 0xe;
    local_459 = 0xf;
    local_45a = 8;
    local_45b = 9;
    local_45c = 10;
    y_02[0]._1_7_ = alVar33[1]._1_7_;
    local_219 = 10;
    local_21a = 9;
    local_21b = 8;
    local_21c = 0xf;
    local_21d = 0xe;
    local_21e = 0xd;
    local_21f = 0xc;
    local_220 = 0xb;
    local_221 = 2;
    local_222 = 1;
    local_223 = 0;
    local_224 = 7;
    local_225 = 6;
    local_226 = 5;
    local_227 = 4;
    local_228 = 3;
    local_578 = 0x201000706050403;
    uStack_570 = 0xa09080f0e0d0c0b;
    auVar26._8_8_ = 0xa09080f0e0d0c0b;
    auVar26._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar26);
    *(undefined1 (*) [16])(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    local_588 = *(undefined8 *)*pauVar3;
    uStack_580 = *(undefined8 *)(*pauVar3 + 8);
    local_45d = 3;
    local_45e = 4;
    local_45f = 5;
    local_460 = 6;
    local_461 = 7;
    local_462 = 0;
    local_463 = 1;
    local_464 = 2;
    local_465 = 0xb;
    local_466 = 0xc;
    local_467 = 0xd;
    local_468 = 0xe;
    local_469 = 0xf;
    local_46a = 8;
    local_46b = 9;
    local_46c = 10;
    x_03[0] = CONCAT71((int7)((ulong)alVar34[0] >> 8),7);
    x_03[1] = CONCAT71((int7)((ulong)alVar34[1] >> 8),6);
    y_02[0]._0_1_ = 5;
    local_1f9 = 10;
    local_1fa = 9;
    local_1fb = 8;
    local_1fc = 0xf;
    local_1fd = 0xe;
    local_1fe = 0xd;
    local_1ff = 0xc;
    local_200 = 0xb;
    local_201 = 2;
    local_202 = 1;
    local_203 = 0;
    local_204 = 7;
    local_205 = 6;
    local_206 = 5;
    local_207 = 4;
    local_208 = 3;
    local_598 = 0x201000706050403;
    uStack_590 = 0xa09080f0e0d0c0b;
    auVar25._8_8_ = 0xa09080f0e0d0c0b;
    auVar25._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar25);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10) = auVar32;
    y_02[1] = (ulong)(local_111c << 3) * 0x10;
    local_238 = local_578;
    uStack_230 = uStack_570;
    local_218 = local_598;
    uStack_210 = uStack_590;
    alVar34 = fBlaMka(x_03,y_02);
    y_03[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_03;
    puVar28[1] = extraout_XMM0_Qb_03;
    y_03[1] = (ulong)(local_111c << 3) * 0x10;
    x_04[1] = x_03[1];
    x_04[0] = x_03[0];
    alVar33 = fBlaMka(x_04,y_03);
    puVar28 = (undefined8 *)(local_d00 + 0x10 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_04;
    puVar28[1] = extraout_XMM0_Qb_04;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + alVar34[1]);
    local_878 = *puVar27;
    uStack_870 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + alVar34[1]);
    local_868 = *puVar27;
    uStack_860 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_868 ^ local_878;
    puVar27[1] = uStack_860 ^ uStack_870;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x10 + alVar34[1]);
    local_898 = *puVar27;
    uStack_890 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + alVar34[1]);
    local_888 = *puVar27;
    uStack_880 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_888 ^ local_898;
    puVar27[1] = uStack_880 ^ uStack_890;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    local_5a8 = *(undefined8 *)*pauVar3;
    uStack_5a0 = *(undefined8 *)(*pauVar3 + 8);
    local_46d = 2;
    local_46e = 3;
    local_46f = 4;
    local_470 = 5;
    local_471 = 6;
    local_472 = 7;
    local_473 = 0;
    local_474 = 1;
    local_475 = 10;
    local_476 = 0xb;
    local_477 = 0xc;
    local_478 = 0xd;
    local_479 = 0xe;
    local_47a = 0xf;
    local_47b = 8;
    local_47c = 9;
    y_04[0]._1_7_ = alVar33[1]._1_7_;
    local_1d9 = 9;
    local_1da = 8;
    local_1db = 0xf;
    local_1dc = 0xe;
    local_1dd = 0xd;
    local_1de = 0xc;
    local_1df = 0xb;
    local_1e0 = 10;
    local_1e1 = 1;
    local_1e2 = 0;
    local_1e3 = 7;
    local_1e4 = 6;
    local_1e5 = 5;
    local_1e6 = 4;
    local_1e7 = 3;
    local_1e8 = 2;
    local_5b8 = 0x100070605040302;
    uStack_5b0 = 0x9080f0e0d0c0b0a;
    auVar24._8_8_ = 0x9080f0e0d0c0b0a;
    auVar24._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar24);
    *(undefined1 (*) [16])(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    local_5c8 = *(undefined8 *)*pauVar3;
    uStack_5c0 = *(undefined8 *)(*pauVar3 + 8);
    local_47d = 2;
    local_47e = 3;
    local_47f = 4;
    local_480 = 5;
    local_481 = 6;
    local_482 = 7;
    local_483 = 0;
    local_484 = 1;
    local_485 = 10;
    local_486 = 0xb;
    local_487 = 0xc;
    local_488 = 0xd;
    local_489 = 0xe;
    local_48a = 0xf;
    local_48b = 8;
    local_48c = 9;
    x_05[0] = CONCAT71((int7)((ulong)x_03[0] >> 8),6);
    x_05[1] = CONCAT71((int7)((ulong)x_03[1] >> 8),5);
    y_04[0]._0_1_ = 4;
    local_1b9 = 9;
    local_1ba = 8;
    local_1bb = 0xf;
    local_1bc = 0xe;
    local_1bd = 0xd;
    local_1be = 0xc;
    local_1bf = 0xb;
    local_1c0 = 10;
    local_1c1 = 1;
    local_1c2 = 0;
    local_1c3 = 7;
    local_1c4 = 6;
    local_1c5 = 5;
    local_1c6 = 4;
    local_1c7 = 3;
    local_1c8 = 2;
    local_5d8 = 0x100070605040302;
    uStack_5d0 = 0x9080f0e0d0c0b0a;
    auVar23._8_8_ = 0x9080f0e0d0c0b0a;
    auVar23._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar23);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c * 8 + 7) * 0x10) = auVar32;
    y_04[1] = (ulong)(local_111c * 8 + 6) << 4;
    local_1f8 = local_5b8;
    uStack_1f0 = uStack_5b0;
    local_1d8 = local_5d8;
    uStack_1d0 = uStack_5d0;
    alVar34 = fBlaMka(x_05,y_04);
    y_05[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 4) * 0x10);
    *puVar28 = extraout_XMM0_Qa_05;
    puVar28[1] = extraout_XMM0_Qb_05;
    y_05[1] = (ulong)(local_111c * 8 + 7) << 4;
    x_06[1] = x_05[1];
    x_06[0] = x_05[0];
    alVar34 = fBlaMka(x_06,y_05);
    y_06[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 5) * 0x10);
    *puVar28 = extraout_XMM0_Qa_06;
    puVar28[1] = extraout_XMM0_Qb_06;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_8a8 = *puVar27;
    uStack_8a0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 4) * 0x10);
    local_8b8 = *puVar27;
    uStack_8b0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    *puVar27 = local_8a8 ^ local_8b8;
    puVar27[1] = uStack_8a0 ^ uStack_8b0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_8c8 = *puVar27;
    uStack_8c0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 5) * 0x10);
    local_8d8 = *puVar27;
    uStack_8d0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    *puVar27 = local_8c8 ^ local_8d8;
    puVar27[1] = uStack_8c0 ^ uStack_8d0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_368 = *puVar27;
    uStack_360 = puVar27[1];
    local_36c = 0x3f;
    local_8e8 = local_368 >> 0x3f;
    uStack_8e0 = uStack_360 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_268 = *plVar29;
    lStack_260 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_278 = *plVar29;
    lStack_270 = plVar29[1];
    local_8f8 = local_268 + local_278;
    uStack_8f0 = lStack_260 + lStack_270;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    *puVar27 = local_8e8 ^ local_8f8;
    puVar27[1] = uStack_8e0 ^ uStack_8f0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_388 = *puVar27;
    uStack_380 = puVar27[1];
    local_38c = 0x3f;
    local_908 = local_388 >> 0x3f;
    uStack_900 = uStack_380 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_288 = *plVar29;
    lStack_280 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_298 = *plVar29;
    lStack_290 = plVar29[1];
    local_918 = local_288 + local_298;
    uStack_910 = lStack_280 + lStack_290;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    *puVar27 = local_908 ^ local_918;
    puVar27[1] = uStack_900 ^ uStack_910;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10 + 0x28);
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    uVar8 = *(undefined8 *)(local_d00 + alVar34[1] + 0x38);
    puVar28 = (undefined8 *)(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = *(undefined8 *)(local_d00 + alVar34[1] + 0x30);
    puVar28[1] = uVar7;
    puVar28 = (undefined8 *)(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = local_1148;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + 0x40 + (ulong)(local_111c << 3) * 0x10);
    uVar7 = *puVar28;
    uVar8 = puVar28[1];
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar28 = (undefined8 *)(local_d00 + 0x50 + alVar34[1]);
    uVar9 = puVar28[1];
    puVar31 = (undefined8 *)(local_d00 + 0x40 + alVar34[1]);
    *puVar31 = *puVar28;
    puVar31[1] = uVar9;
    puVar28 = (undefined8 *)(local_d00 + 0x50 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = uVar7;
    puVar28[1] = uVar8;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10 + 0x68);
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    uVar9 = *(undefined8 *)(local_d00 + alVar34[1] + 0x70);
    uVar8 = *(undefined8 *)(local_d00 + alVar34[1] + 0x78);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 6) * 0x10);
    *puVar28 = local_1148;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 7) * 0x10);
    *puVar28 = uVar9;
    puVar28[1] = uVar7;
    y_06[1] = (ulong)(local_111c << 3) * 0x10;
    x_07[1] = x_05[1];
    x_07[0] = x_05[0];
    alVar34 = fBlaMka(x_07,y_06);
    y_07[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_07;
    puVar28[1] = extraout_XMM0_Qb_07;
    y_07[1] = (ulong)(local_111c << 3) * 0x10;
    x_08[1] = x_05[1];
    x_08[0] = x_05[0];
    alVar34 = fBlaMka(x_08,y_07);
    y_08[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + 0x10 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_08;
    puVar28[1] = extraout_XMM0_Qb_08;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + alVar34[1]);
    local_938 = *puVar27;
    uStack_930 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + alVar34[1]);
    local_928 = *puVar27;
    uStack_920 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_928 ^ local_938;
    puVar27[1] = uStack_920 ^ uStack_930;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x10 + alVar34[1]);
    local_958 = *puVar27;
    uStack_950 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + alVar34[1]);
    local_948 = *puVar27;
    uStack_940 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_948 ^ local_958;
    puVar27[1] = uStack_940 ^ uStack_950;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + 0x60 + alVar34[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + 0x60 + alVar34[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + 0x70 + alVar34[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + 0x70 + alVar34[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    y_08[1] = (ulong)(local_111c << 3) * 0x10;
    x_09[1] = x_05[1];
    x_09[0] = x_05[0];
    alVar34 = fBlaMka(x_09,y_08);
    y_09[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + 0x40 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_09;
    puVar28[1] = extraout_XMM0_Qb_09;
    y_09[1] = (ulong)(local_111c << 3) * 0x10;
    x_10[1] = x_05[1];
    x_10[0] = x_05[0];
    alVar33 = fBlaMka(x_10,y_09);
    puVar28 = (undefined8 *)(local_d00 + 0x50 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_10;
    puVar28[1] = extraout_XMM0_Qb_10;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x20 + alVar34[1]);
    local_968 = *puVar27;
    uStack_960 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x40 + alVar34[1]);
    local_978 = *puVar27;
    uStack_970 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_968 ^ local_978;
    puVar27[1] = uStack_960 ^ uStack_970;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x30 + alVar34[1]);
    local_988 = *puVar27;
    uStack_980 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x50 + alVar34[1]);
    local_998 = *puVar27;
    uStack_990 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_988 ^ local_998;
    puVar27[1] = uStack_980 ^ uStack_990;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    local_5e8 = *(undefined8 *)*pauVar3;
    uStack_5e0 = *(undefined8 *)(*pauVar3 + 8);
    local_48d = 3;
    local_48e = 4;
    local_48f = 5;
    local_490 = 6;
    local_491 = 7;
    local_492 = 0;
    local_493 = 1;
    local_494 = 2;
    local_495 = 0xb;
    local_496 = 0xc;
    local_497 = 0xd;
    local_498 = 0xe;
    local_499 = 0xf;
    local_49a = 8;
    local_49b = 9;
    local_49c = 10;
    y_10[0]._1_7_ = alVar33[1]._1_7_;
    local_199 = 10;
    local_19a = 9;
    local_19b = 8;
    local_19c = 0xf;
    local_19d = 0xe;
    local_19e = 0xd;
    local_19f = 0xc;
    local_1a0 = 0xb;
    local_1a1 = 2;
    local_1a2 = 1;
    local_1a3 = 0;
    local_1a4 = 7;
    local_1a5 = 6;
    local_1a6 = 5;
    local_1a7 = 4;
    local_1a8 = 3;
    local_5f8 = 0x201000706050403;
    uStack_5f0 = 0xa09080f0e0d0c0b;
    auVar22._8_8_ = 0xa09080f0e0d0c0b;
    auVar22._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar22);
    *(undefined1 (*) [16])(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    local_608 = *(undefined8 *)*pauVar3;
    uStack_600 = *(undefined8 *)(*pauVar3 + 8);
    local_49d = 3;
    local_49e = 4;
    local_49f = 5;
    local_4a0 = 6;
    local_4a1 = 7;
    local_4a2 = 0;
    local_4a3 = 1;
    local_4a4 = 2;
    local_4a5 = 0xb;
    local_4a6 = 0xc;
    local_4a7 = 0xd;
    local_4a8 = 0xe;
    local_4a9 = 0xf;
    local_4aa = 8;
    local_4ab = 9;
    local_4ac = 10;
    x_11[0] = CONCAT71((int7)((ulong)x_05[0] >> 8),7);
    x_11[1] = CONCAT71((int7)((ulong)x_05[1] >> 8),6);
    y_10[0]._0_1_ = 5;
    local_179 = 10;
    local_17a = 9;
    local_17b = 8;
    local_17c = 0xf;
    local_17d = 0xe;
    local_17e = 0xd;
    local_17f = 0xc;
    local_180 = 0xb;
    local_181 = 2;
    local_182 = 1;
    local_183 = 0;
    local_184 = 7;
    local_185 = 6;
    local_186 = 5;
    local_187 = 4;
    local_188 = 3;
    local_618 = 0x201000706050403;
    uStack_610 = 0xa09080f0e0d0c0b;
    auVar21._8_8_ = 0xa09080f0e0d0c0b;
    auVar21._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar21);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10) = auVar32;
    y_10[1] = (ulong)(local_111c << 3) * 0x10;
    local_1b8 = local_5f8;
    uStack_1b0 = uStack_5f0;
    local_198 = local_618;
    uStack_190 = uStack_610;
    alVar34 = fBlaMka(x_11,y_10);
    y_11[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_11;
    puVar28[1] = extraout_XMM0_Qb_11;
    y_11[1] = (ulong)(local_111c << 3) * 0x10;
    x_12[1] = x_11[1];
    x_12[0] = x_11[0];
    alVar33 = fBlaMka(x_12,y_11);
    puVar28 = (undefined8 *)(local_d00 + 0x10 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = extraout_XMM0_Qa_12;
    puVar28[1] = extraout_XMM0_Qb_12;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + alVar34[1]);
    local_9b8 = *puVar27;
    uStack_9b0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + alVar34[1]);
    local_9a8 = *puVar27;
    uStack_9a0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_9a8 ^ local_9b8;
    puVar27[1] = uStack_9a0 ^ uStack_9b0;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar27 = (ulong *)(local_d00 + 0x10 + alVar34[1]);
    local_9d8 = *puVar27;
    uStack_9d0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + alVar34[1]);
    local_9c8 = *puVar27;
    uStack_9c0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    *puVar27 = local_9c8 ^ local_9d8;
    puVar27[1] = uStack_9c0 ^ uStack_9d0;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10);
    local_628 = *(undefined8 *)*pauVar3;
    uStack_620 = *(undefined8 *)(*pauVar3 + 8);
    local_4ad = 2;
    local_4ae = 3;
    local_4af = 4;
    local_4b0 = 5;
    local_4b1 = 6;
    local_4b2 = 7;
    local_4b3 = 0;
    local_4b4 = 1;
    local_4b5 = 10;
    local_4b6 = 0xb;
    local_4b7 = 0xc;
    local_4b8 = 0xd;
    local_4b9 = 0xe;
    local_4ba = 0xf;
    local_4bb = 8;
    local_4bc = 9;
    y_12[0]._1_7_ = alVar33[1]._1_7_;
    local_159 = 9;
    local_15a = 8;
    local_15b = 0xf;
    local_15c = 0xe;
    local_15d = 0xd;
    local_15e = 0xc;
    local_15f = 0xb;
    local_160 = 10;
    local_161 = 1;
    local_162 = 0;
    local_163 = 7;
    local_164 = 6;
    local_165 = 5;
    local_166 = 4;
    local_167 = 3;
    local_168 = 2;
    local_638 = 0x100070605040302;
    uStack_630 = 0x9080f0e0d0c0b0a;
    auVar20._8_8_ = 0x9080f0e0d0c0b0a;
    auVar20._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar20);
    *(undefined1 (*) [16])(local_d00 + 0x60 + (ulong)(local_111c << 3) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + 0x70 + (ulong)(local_111c << 3) * 0x10);
    local_648 = *(undefined8 *)*pauVar3;
    uStack_640 = *(undefined8 *)(*pauVar3 + 8);
    local_4bd = 2;
    local_4be = 3;
    local_4bf = 4;
    local_4c0 = 5;
    local_4c1 = 6;
    local_4c2 = 7;
    local_4c3 = 0;
    local_4c4 = 1;
    local_4c5 = 10;
    local_4c6 = 0xb;
    local_4c7 = 0xc;
    local_4c8 = 0xd;
    local_4c9 = 0xe;
    local_4ca = 0xf;
    local_4cb = 8;
    local_4cc = 9;
    x_13[0] = CONCAT71((int7)((ulong)x_11[0] >> 8),6);
    x_13[1] = CONCAT71((int7)((ulong)x_11[1] >> 8),5);
    y_12[0]._0_1_ = 4;
    local_139 = 9;
    local_13a = 8;
    local_13b = 0xf;
    local_13c = 0xe;
    local_13d = 0xd;
    local_13e = 0xc;
    local_13f = 0xb;
    local_140 = 10;
    local_141 = 1;
    local_142 = 0;
    local_143 = 7;
    local_144 = 6;
    local_145 = 5;
    local_146 = 4;
    local_147 = 3;
    local_148 = 2;
    local_658 = 0x100070605040302;
    uStack_650 = 0x9080f0e0d0c0b0a;
    auVar32._8_8_ = 0x9080f0e0d0c0b0a;
    auVar32._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar32);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c * 8 + 7) * 0x10) = auVar32;
    y_12[1] = (ulong)(local_111c * 8 + 6) << 4;
    local_178 = local_638;
    uStack_170 = uStack_630;
    local_158 = local_658;
    uStack_150 = uStack_650;
    alVar34 = fBlaMka(x_13,y_12);
    y_13[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 4) * 0x10);
    *puVar28 = extraout_XMM0_Qa_13;
    puVar28[1] = extraout_XMM0_Qb_13;
    y_13[1] = (ulong)(local_111c * 8 + 7) << 4;
    x_14[1] = x_13[1];
    x_14[0] = x_13[0];
    alVar34 = fBlaMka(x_14,y_13);
    in_RDX = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 5) * 0x10);
    *puVar28 = extraout_XMM0_Qa_14;
    puVar28[1] = extraout_XMM0_Qb_14;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_9e8 = *puVar27;
    uStack_9e0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 4) * 0x10);
    local_9f8 = *puVar27;
    uStack_9f0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    *puVar27 = local_9e8 ^ local_9f8;
    puVar27[1] = uStack_9e0 ^ uStack_9f0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_a08 = *puVar27;
    uStack_a00 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 5) * 0x10);
    local_a18 = *puVar27;
    uStack_a10 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    *puVar27 = local_a08 ^ local_a18;
    puVar27[1] = uStack_a00 ^ uStack_a10;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_3a8 = *puVar27;
    uStack_3a0 = puVar27[1];
    local_3ac = 0x3f;
    local_a28 = local_3a8 >> 0x3f;
    uStack_a20 = uStack_3a0 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_2a8 = *plVar29;
    lStack_2a0 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    local_2b8 = *plVar29;
    lStack_2b0 = plVar29[1];
    local_a38 = local_2a8 + local_2b8;
    uStack_a30 = lStack_2a0 + lStack_2b0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 2) * 0x10);
    *puVar27 = local_a28 ^ local_a38;
    puVar27[1] = uStack_a20 ^ uStack_a30;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_3c8 = *puVar27;
    uStack_3c0 = puVar27[1];
    local_3cc = 0x3f;
    local_a48 = local_3c8 >> 0x3f;
    uStack_a40 = uStack_3c0 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_2c8 = *plVar29;
    lStack_2c0 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    local_2d8 = *plVar29;
    lStack_2d0 = plVar29[1];
    local_a58 = local_2c8 + local_2d8;
    uStack_a50 = lStack_2c0 + lStack_2d0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c * 8 + 3) * 0x10);
    *puVar27 = local_a48 ^ local_a58;
    puVar27[1] = uStack_a40 ^ uStack_a50;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c << 3) * 0x10 + 0x38);
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    uVar8 = *(undefined8 *)(local_d00 + alVar34[1] + 0x28);
    puVar28 = (undefined8 *)(local_d00 + 0x20 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = *(undefined8 *)(local_d00 + alVar34[1] + 0x40);
    puVar28[1] = uVar7;
    puVar28 = (undefined8 *)(local_d00 + 0x30 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = local_1168;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + 0x40 + (ulong)(local_111c << 3) * 0x10);
    uVar7 = *puVar28;
    uVar8 = puVar28[1];
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    puVar28 = (undefined8 *)(local_d00 + 0x50 + alVar34[1]);
    uVar9 = puVar28[1];
    puVar31 = (undefined8 *)(local_d00 + 0x40 + alVar34[1]);
    *puVar31 = *puVar28;
    puVar31[1] = uVar9;
    puVar28 = (undefined8 *)(local_d00 + 0x50 + (ulong)(local_111c << 3) * 0x10);
    *puVar28 = uVar7;
    puVar28[1] = uVar8;
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    local_1148 = *(undefined8 *)(local_d00 + alVar34[1] + 0x70);
    uVar7 = *(undefined8 *)(local_d00 + alVar34[1] + 0x78);
    alVar34[1] = (ulong)(local_111c << 3) * 0x10;
    uVar8 = *(undefined8 *)(local_d00 + alVar34[1] + 0x68);
    uVar9 = *(undefined8 *)(local_d00 + alVar34[1] + 0x80);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 6) * 0x10);
    *puVar28 = local_1168;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c * 8 + 7) * 0x10);
    *puVar28 = uVar9;
    puVar28[1] = uVar7;
    alVar34[1] = x_13[1];
    alVar34[0] = x_13[0];
  }
  for (local_111c = 0; local_111c < 8; local_111c = local_111c + 1) {
    y_14[0] = (ulong)local_111c << 4;
    y_14[1] = (ulong)(local_111c + 0x10) * 0x10;
    x_15[1] = alVar34[1];
    x_15[0] = alVar34[0];
    fBlaMka(x_15,y_14);
    puVar28 = (undefined8 *)(local_d00 + (ulong)local_111c * 0x10);
    *puVar28 = extraout_XMM0_Qa_15;
    puVar28[1] = extraout_XMM0_Qb_15;
    y_15[0] = (ulong)(local_111c + 8) << 4;
    y_15[1] = (ulong)(local_111c + 0x18) * 0x10;
    x_16[1] = alVar34[1];
    x_16[0] = alVar34[0];
    fBlaMka(x_16,y_15);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    *puVar28 = extraout_XMM0_Qa_16;
    puVar28[1] = extraout_XMM0_Qb_16;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_a68 = *puVar27;
    uStack_a60 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    local_a78 = *puVar27;
    uStack_a70 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar27 = local_a68 ^ local_a78;
    puVar27[1] = uStack_a60 ^ uStack_a70;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    local_a88 = *puVar27;
    uStack_a80 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    local_a98 = *puVar27;
    uStack_a90 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar27 = local_a88 ^ local_a98;
    puVar27[1] = uStack_a80 ^ uStack_a90;
    x_13[1] = (ulong)(local_111c + 0x30) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + x_13[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + x_13[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    x_13[1] = (ulong)(local_111c + 0x38) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + x_13[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + x_13[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    y_16[0] = (ulong)(local_111c + 0x20) << 4;
    y_16[1] = (ulong)(local_111c + 0x30) * 0x10;
    x_17[1] = alVar34[1];
    x_17[0] = alVar34[0];
    fBlaMka(x_17,y_16);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar28 = extraout_XMM0_Qa_17;
    puVar28[1] = extraout_XMM0_Qb_17;
    y_17[0] = (ulong)(local_111c + 0x28) << 4;
    y_17[1] = (ulong)(local_111c + 0x38) * 0x10;
    x_18[1] = alVar34[1];
    x_18[0] = alVar34[0];
    fBlaMka(x_18,y_17);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = extraout_XMM0_Qa_18;
    puVar28[1] = extraout_XMM0_Qb_18;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_aa8 = *puVar27;
    uStack_aa0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    local_ab8 = *puVar27;
    uStack_ab0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_aa8 ^ local_ab8;
    puVar27[1] = uStack_aa0 ^ uStack_ab0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_ac8 = *puVar27;
    uStack_ac0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    local_ad8 = *puVar27;
    uStack_ad0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_ac8 ^ local_ad8;
    puVar27[1] = uStack_ac0 ^ uStack_ad0;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_668 = *(undefined8 *)*pauVar3;
    uStack_660 = *(undefined8 *)(*pauVar3 + 8);
    local_4cd = 3;
    local_4ce = 4;
    local_4cf = 5;
    local_4d0 = 6;
    local_4d1 = 7;
    local_4d2 = 0;
    local_4d3 = 1;
    local_4d4 = 2;
    local_4d5 = 0xb;
    local_4d6 = 0xc;
    local_4d7 = 0xd;
    local_4d8 = 0xe;
    local_4d9 = 0xf;
    local_4da = 8;
    local_4db = 9;
    local_4dc = 10;
    local_119 = 10;
    local_11a = 9;
    local_11b = 8;
    local_11c = 0xf;
    local_11d = 0xe;
    local_11e = 0xd;
    local_11f = 0xc;
    local_120 = 0xb;
    local_121 = 2;
    local_122 = 1;
    local_123 = 0;
    local_124 = 7;
    local_125 = 6;
    local_126 = 5;
    local_127 = 4;
    local_128 = 3;
    local_678 = 0x201000706050403;
    uStack_670 = 0xa09080f0e0d0c0b;
    auVar19._8_8_ = 0xa09080f0e0d0c0b;
    auVar19._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar19);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x10) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_688 = *(undefined8 *)*pauVar3;
    uStack_680 = *(undefined8 *)(*pauVar3 + 8);
    local_4dd = 3;
    local_4de = 4;
    local_4df = 5;
    local_4e0 = 6;
    local_4e1 = 7;
    local_4e2 = 0;
    local_4e3 = 1;
    local_4e4 = 2;
    local_4e5 = 0xb;
    local_4e6 = 0xc;
    local_4e7 = 0xd;
    local_4e8 = 0xe;
    local_4e9 = 0xf;
    local_4ea = 8;
    local_4eb = 9;
    local_4ec = 10;
    x_19[0] = CONCAT71((int7)((ulong)alVar34[0] >> 8),7);
    x_19[1] = CONCAT71((int7)((ulong)alVar34[1] >> 8),6);
    local_f9 = 10;
    local_fa = 9;
    local_fb = 8;
    local_fc = 0xf;
    local_fd = 0xe;
    local_fe = 0xd;
    local_ff = 0xc;
    local_100 = 0xb;
    local_101 = 2;
    local_102 = 1;
    local_103 = 0;
    local_104 = 7;
    local_105 = 6;
    local_106 = 5;
    local_107 = 4;
    local_108 = 3;
    local_698 = 0x201000706050403;
    uStack_690 = 0xa09080f0e0d0c0b;
    auVar18._8_8_ = 0xa09080f0e0d0c0b;
    auVar18._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar18);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x18) * 0x10) = auVar32;
    y_18[0] = (ulong)local_111c << 4;
    y_18[1] = (ulong)(local_111c + 0x10) * 0x10;
    local_138 = local_678;
    uStack_130 = uStack_670;
    local_118 = local_698;
    uStack_110 = uStack_690;
    fBlaMka(x_19,y_18);
    puVar28 = (undefined8 *)(local_d00 + (ulong)local_111c * 0x10);
    *puVar28 = extraout_XMM0_Qa_19;
    puVar28[1] = extraout_XMM0_Qb_19;
    y_19[0] = (ulong)(local_111c + 8) << 4;
    y_19[1] = (ulong)(local_111c + 0x18) * 0x10;
    x_20[1] = x_19[1];
    x_20[0] = x_19[0];
    fBlaMka(x_20,y_19);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    *puVar28 = extraout_XMM0_Qa_20;
    puVar28[1] = extraout_XMM0_Qb_20;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_ae8 = *puVar27;
    uStack_ae0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    local_af8 = *puVar27;
    uStack_af0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar27 = local_ae8 ^ local_af8;
    puVar27[1] = uStack_ae0 ^ uStack_af0;
    alVar34[1] = (ulong)(local_111c + 0x38) * 0x10;
    puVar27 = (ulong *)(local_d00 + alVar34[1]);
    local_b08 = *puVar27;
    uStack_b00 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    local_b18 = *puVar27;
    uStack_b10 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar27 = local_b08 ^ local_b18;
    puVar27[1] = uStack_b00 ^ uStack_b10;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_6a8 = *(undefined8 *)*pauVar3;
    uStack_6a0 = *(undefined8 *)(*pauVar3 + 8);
    local_4ed = 2;
    local_4ee = 3;
    local_4ef = 4;
    local_4f0 = 5;
    local_4f1 = 6;
    local_4f2 = 7;
    local_4f3 = 0;
    local_4f4 = 1;
    local_4f5 = 10;
    local_4f6 = 0xb;
    local_4f7 = 0xc;
    local_4f8 = 0xd;
    local_4f9 = 0xe;
    local_4fa = 0xf;
    local_4fb = 8;
    local_4fc = 9;
    y_20[0]._1_7_ = (undefined7)((ulong)alVar34[1] >> 8);
    local_d9 = 9;
    local_da = 8;
    local_db = 0xf;
    local_dc = 0xe;
    local_dd = 0xd;
    local_de = 0xc;
    local_df = 0xb;
    local_e0 = 10;
    local_e1 = 1;
    local_e2 = 0;
    local_e3 = 7;
    local_e4 = 6;
    local_e5 = 5;
    local_e6 = 4;
    local_e7 = 3;
    local_e8 = 2;
    local_6b8 = 0x100070605040302;
    uStack_6b0 = 0x9080f0e0d0c0b0a;
    auVar17._8_8_ = 0x9080f0e0d0c0b0a;
    auVar17._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar17);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x30) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    local_6c8 = *(undefined8 *)*pauVar3;
    uStack_6c0 = *(undefined8 *)(*pauVar3 + 8);
    local_4fd = 2;
    local_4fe = 3;
    local_4ff = 4;
    local_500 = 5;
    local_501 = 6;
    local_502 = 7;
    local_503 = 0;
    local_504 = 1;
    local_505 = 10;
    local_506 = 0xb;
    local_507 = 0xc;
    local_508 = 0xd;
    local_509 = 0xe;
    local_50a = 0xf;
    local_50b = 8;
    local_50c = 9;
    x_21[0] = CONCAT71((int7)((ulong)x_19[0] >> 8),6);
    x_21[1] = CONCAT71((int7)((ulong)x_19[1] >> 8),5);
    y_20[0]._0_1_ = 4;
    local_b9 = 9;
    local_ba = 8;
    local_bb = 0xf;
    local_bc = 0xe;
    local_bd = 0xd;
    local_be = 0xc;
    local_bf = 0xb;
    local_c0 = 10;
    local_c1 = 1;
    local_c2 = 0;
    local_c3 = 7;
    local_c4 = 6;
    local_c5 = 5;
    local_c6 = 4;
    local_c7 = 3;
    local_c8 = 2;
    local_6d8 = 0x100070605040302;
    uStack_6d0 = 0x9080f0e0d0c0b0a;
    auVar16._8_8_ = 0x9080f0e0d0c0b0a;
    auVar16._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar16);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x38) * 0x10) = auVar32;
    y_20[1] = (ulong)(local_111c + 0x30) << 4;
    local_f8 = local_6b8;
    uStack_f0 = uStack_6b0;
    local_d8 = local_6d8;
    uStack_d0 = uStack_6d0;
    alVar34 = fBlaMka(x_21,y_20);
    y_21[0] = alVar34[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar28 = extraout_XMM0_Qa_21;
    puVar28[1] = extraout_XMM0_Qb_21;
    y_21[1] = (ulong)(local_111c + 0x38) << 4;
    x_22[1] = x_21[1];
    x_22[0] = x_21[0];
    fBlaMka(x_22,y_21);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = extraout_XMM0_Qa_22;
    puVar28[1] = extraout_XMM0_Qb_22;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_b28 = *puVar27;
    uStack_b20 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    local_b38 = *puVar27;
    uStack_b30 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_b28 ^ local_b38;
    puVar27[1] = uStack_b20 ^ uStack_b30;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_b48 = *puVar27;
    uStack_b40 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    local_b58 = *puVar27;
    uStack_b50 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_b48 ^ local_b58;
    puVar27[1] = uStack_b40 ^ uStack_b50;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_3e8 = *puVar27;
    uStack_3e0 = puVar27[1];
    local_3ec = 0x3f;
    local_b68 = local_3e8 >> 0x3f;
    uStack_b60 = uStack_3e0 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_2e8 = *plVar29;
    lStack_2e0 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_2f8 = *plVar29;
    lStack_2f0 = plVar29[1];
    local_b78 = local_2e8 + local_2f8;
    uStack_b70 = lStack_2e0 + lStack_2f0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_b68 ^ local_b78;
    puVar27[1] = uStack_b60 ^ uStack_b70;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_408 = *puVar27;
    uStack_400 = puVar27[1];
    local_40c = 0x3f;
    local_b88 = local_408 >> 0x3f;
    uStack_b80 = uStack_400 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_308 = *plVar29;
    lStack_300 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_318 = *plVar29;
    lStack_310 = plVar29[1];
    local_b98 = local_308 + local_318;
    uStack_b90 = lStack_300 + lStack_310;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_b88 ^ local_b98;
    puVar27[1] = uStack_b80 ^ uStack_b90;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10 + 8);
    uVar8 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10 + 8);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar28 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10 + 0x10);
    puVar28[1] = uVar7;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar28 = local_1188;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    uVar7 = *puVar28;
    uVar8 = puVar28[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    uVar9 = puVar28[1];
    puVar31 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar31 = *puVar28;
    puVar31[1] = uVar9;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = uVar7;
    puVar28[1] = uVar8;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10 + 8);
    uVar9 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10 + 0x10);
    uVar8 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10 + 8);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar28 = local_1188;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar28 = uVar9;
    puVar28[1] = uVar7;
    y_22[0] = (ulong)local_111c << 4;
    y_22[1] = (ulong)(local_111c + 0x10) * 0x10;
    x_23[1] = x_21[1];
    x_23[0] = x_21[0];
    fBlaMka(x_23,y_22);
    puVar28 = (undefined8 *)(local_d00 + (ulong)local_111c * 0x10);
    *puVar28 = extraout_XMM0_Qa_23;
    puVar28[1] = extraout_XMM0_Qb_23;
    y_23[0] = (ulong)(local_111c + 8) << 4;
    y_23[1] = (ulong)(local_111c + 0x18) * 0x10;
    x_24[1] = x_21[1];
    x_24[0] = x_21[0];
    fBlaMka(x_24,y_23);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    *puVar28 = extraout_XMM0_Qa_24;
    puVar28[1] = extraout_XMM0_Qb_24;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_ba8 = *puVar27;
    uStack_ba0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    local_bb8 = *puVar27;
    uStack_bb0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar27 = local_ba8 ^ local_bb8;
    puVar27[1] = uStack_ba0 ^ uStack_bb0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    local_bc8 = *puVar27;
    uStack_bc0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    local_bd8 = *puVar27;
    uStack_bd0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar27 = local_bc8 ^ local_bd8;
    puVar27[1] = uStack_bc0 ^ uStack_bd0;
    alVar34[1] = (ulong)(local_111c + 0x30) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + alVar34[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + alVar34[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    alVar34[1] = (ulong)(local_111c + 0x38) * 0x10;
    puVar1 = (undefined4 *)(local_d00 + alVar34[1]);
    uVar4 = *puVar1;
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (undefined4 *)(local_d00 + alVar34[1]);
    *puVar2 = puVar1[1];
    puVar2[1] = uVar4;
    puVar2[2] = uVar6;
    puVar2[3] = uVar5;
    y_24[0] = (ulong)(local_111c + 0x20) << 4;
    y_24[1] = (ulong)(local_111c + 0x30) * 0x10;
    x_25[1] = x_21[1];
    x_25[0] = x_21[0];
    fBlaMka(x_25,y_24);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar28 = extraout_XMM0_Qa_25;
    puVar28[1] = extraout_XMM0_Qb_25;
    y_25[0] = (ulong)(local_111c + 0x28) << 4;
    y_25[1] = (ulong)(local_111c + 0x38) * 0x10;
    x_26[1] = x_21[1];
    x_26[0] = x_21[0];
    fBlaMka(x_26,y_25);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = extraout_XMM0_Qa_26;
    puVar28[1] = extraout_XMM0_Qb_26;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_be8 = *puVar27;
    uStack_be0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    local_bf8 = *puVar27;
    uStack_bf0 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_be8 ^ local_bf8;
    puVar27[1] = uStack_be0 ^ uStack_bf0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_c08 = *puVar27;
    uStack_c00 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    local_c18 = *puVar27;
    uStack_c10 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_c08 ^ local_c18;
    puVar27[1] = uStack_c00 ^ uStack_c10;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_6e8 = *(undefined8 *)*pauVar3;
    uStack_6e0 = *(undefined8 *)(*pauVar3 + 8);
    local_50d = 3;
    local_50e = 4;
    local_50f = 5;
    local_510 = 6;
    local_511 = 7;
    local_512 = 0;
    local_513 = 1;
    local_514 = 2;
    local_515 = 0xb;
    local_516 = 0xc;
    local_517 = 0xd;
    local_518 = 0xe;
    local_519 = 0xf;
    local_51a = 8;
    local_51b = 9;
    local_51c = 10;
    local_99 = 10;
    local_9a = 9;
    local_9b = 8;
    local_9c = 0xf;
    local_9d = 0xe;
    local_9e = 0xd;
    local_9f = 0xc;
    local_a0 = 0xb;
    local_a1 = 2;
    local_a2 = 1;
    local_a3 = 0;
    local_a4 = 7;
    local_a5 = 6;
    local_a6 = 5;
    local_a7 = 4;
    local_a8 = 3;
    local_6f8 = 0x201000706050403;
    uStack_6f0 = 0xa09080f0e0d0c0b;
    auVar15._8_8_ = 0xa09080f0e0d0c0b;
    auVar15._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar15);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x10) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_708 = *(undefined8 *)*pauVar3;
    uStack_700 = *(undefined8 *)(*pauVar3 + 8);
    local_51d = 3;
    local_51e = 4;
    local_51f = 5;
    local_520 = 6;
    local_521 = 7;
    local_522 = 0;
    local_523 = 1;
    local_524 = 2;
    local_525 = 0xb;
    local_526 = 0xc;
    local_527 = 0xd;
    local_528 = 0xe;
    local_529 = 0xf;
    local_52a = 8;
    local_52b = 9;
    local_52c = 10;
    x_27[0] = CONCAT71((int7)((ulong)x_21[0] >> 8),7);
    x_27[1] = CONCAT71((int7)((ulong)x_21[1] >> 8),6);
    local_79 = 10;
    local_7a = 9;
    local_7b = 8;
    local_7c = 0xf;
    local_7d = 0xe;
    local_7e = 0xd;
    local_7f = 0xc;
    local_80 = 0xb;
    local_81 = 2;
    local_82 = 1;
    local_83 = 0;
    local_84 = 7;
    local_85 = 6;
    local_86 = 5;
    local_87 = 4;
    local_88 = 3;
    local_718 = 0x201000706050403;
    uStack_710 = 0xa09080f0e0d0c0b;
    auVar14._8_8_ = 0xa09080f0e0d0c0b;
    auVar14._0_8_ = 0x201000706050403;
    auVar32 = pshufb(*pauVar3,auVar14);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x18) * 0x10) = auVar32;
    y_26[0] = (ulong)local_111c << 4;
    y_26[1] = (ulong)(local_111c + 0x10) * 0x10;
    local_b8 = local_6f8;
    uStack_b0 = uStack_6f0;
    local_98 = local_718;
    uStack_90 = uStack_710;
    fBlaMka(x_27,y_26);
    puVar28 = (undefined8 *)(local_d00 + (ulong)local_111c * 0x10);
    *puVar28 = extraout_XMM0_Qa_27;
    puVar28[1] = extraout_XMM0_Qb_27;
    y_27[0] = (ulong)(local_111c + 8) << 4;
    y_27[1] = (ulong)(local_111c + 0x18) * 0x10;
    x_28[1] = x_27[1];
    x_28[0] = x_27[0];
    fBlaMka(x_28,y_27);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    *puVar28 = extraout_XMM0_Qa_28;
    puVar28[1] = extraout_XMM0_Qb_28;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_c28 = *puVar27;
    uStack_c20 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    local_c38 = *puVar27;
    uStack_c30 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar27 = local_c28 ^ local_c38;
    puVar27[1] = uStack_c20 ^ uStack_c30;
    alVar34[1] = (ulong)(local_111c + 0x38) * 0x10;
    puVar27 = (ulong *)(local_d00 + alVar34[1]);
    local_c48 = *puVar27;
    uStack_c40 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 8) * 0x10);
    local_c58 = *puVar27;
    uStack_c50 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar27 = local_c48 ^ local_c58;
    puVar27[1] = uStack_c40 ^ uStack_c50;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    local_728 = *(undefined8 *)*pauVar3;
    uStack_720 = *(undefined8 *)(*pauVar3 + 8);
    local_52d = 2;
    local_52e = 3;
    local_52f = 4;
    local_530 = 5;
    local_531 = 6;
    local_532 = 7;
    local_533 = 0;
    local_534 = 1;
    local_535 = 10;
    local_536 = 0xb;
    local_537 = 0xc;
    local_538 = 0xd;
    local_539 = 0xe;
    local_53a = 0xf;
    local_53b = 8;
    local_53c = 9;
    y_28[0]._1_7_ = (undefined7)((ulong)alVar34[1] >> 8);
    local_59 = 9;
    local_5a = 8;
    local_5b = 0xf;
    local_5c = 0xe;
    local_5d = 0xd;
    local_5e = 0xc;
    local_5f = 0xb;
    local_60 = 10;
    local_61 = 1;
    local_62 = 0;
    local_63 = 7;
    local_64 = 6;
    local_65 = 5;
    local_66 = 4;
    local_67 = 3;
    local_68 = 2;
    local_738 = 0x100070605040302;
    uStack_730 = 0x9080f0e0d0c0b0a;
    auVar13._8_8_ = 0x9080f0e0d0c0b0a;
    auVar13._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar13);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x30) * 0x10) = auVar32;
    pauVar3 = (undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    local_748 = *(undefined8 *)*pauVar3;
    uStack_740 = *(undefined8 *)(*pauVar3 + 8);
    local_53d = 2;
    local_53e = 3;
    local_53f = 4;
    local_540 = 5;
    local_541 = 6;
    local_542 = 7;
    local_543 = 0;
    local_544 = 1;
    local_545 = 10;
    local_546 = 0xb;
    local_547 = 0xc;
    local_548 = 0xd;
    local_549 = 0xe;
    local_54a = 0xf;
    local_54b = 8;
    local_54c = 9;
    alVar34[0] = CONCAT71((int7)((ulong)x_27[0] >> 8),6);
    alVar34[1] = CONCAT71((int7)((ulong)x_27[1] >> 8),5);
    y_28[0]._0_1_ = 4;
    local_31 = 9;
    local_32 = 8;
    local_33 = 0xf;
    local_34 = 0xe;
    local_35 = 0xd;
    local_36 = 0xc;
    local_37 = 0xb;
    local_38 = 10;
    local_39 = 1;
    local_3a = 0;
    local_3b = 7;
    local_3c = 6;
    local_3d = 5;
    local_3e = 4;
    local_3f = 3;
    local_40 = 2;
    local_758 = 0x100070605040302;
    uStack_750 = 0x9080f0e0d0c0b0a;
    auVar12._8_8_ = 0x9080f0e0d0c0b0a;
    auVar12._0_8_ = 0x100070605040302;
    auVar32 = pshufb(*pauVar3,auVar12);
    *(undefined1 (*) [16])(local_d00 + (ulong)(local_111c + 0x38) * 0x10) = auVar32;
    y_28[1] = (ulong)(local_111c + 0x30) << 4;
    local_78 = local_738;
    uStack_70 = uStack_730;
    local_58 = local_758;
    uStack_50 = uStack_750;
    alVar33 = fBlaMka(alVar34,y_28);
    y_29[0] = alVar33[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar28 = extraout_XMM0_Qa_29;
    puVar28[1] = extraout_XMM0_Qb_29;
    y_29[1] = (ulong)(local_111c + 0x38) << 4;
    x_29[1] = alVar34[1];
    x_29[0] = alVar34[0];
    fBlaMka(x_29,y_29);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = extraout_XMM0_Qa_30;
    puVar28[1] = extraout_XMM0_Qb_30;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_c68 = *puVar27;
    uStack_c60 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    local_c78 = *puVar27;
    uStack_c70 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_c68 ^ local_c78;
    puVar27[1] = uStack_c60 ^ uStack_c70;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_c88 = *puVar27;
    uStack_c80 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    local_c98 = *puVar27;
    uStack_c90 = puVar27[1];
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_c88 ^ local_c98;
    puVar27[1] = uStack_c80 ^ uStack_c90;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_428 = *puVar27;
    uStack_420 = puVar27[1];
    local_42c = 0x3f;
    local_ca8 = local_428 >> 0x3f;
    uStack_ca0 = uStack_420 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_328 = *plVar29;
    lStack_320 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    local_338 = *plVar29;
    lStack_330 = plVar29[1];
    local_cb8 = local_328 + local_338;
    uStack_cb0 = lStack_320 + lStack_330;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar27 = local_ca8 ^ local_cb8;
    puVar27[1] = uStack_ca0 ^ uStack_cb0;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_448 = *puVar27;
    uStack_440 = puVar27[1];
    local_44c = 0x3f;
    local_cc8 = local_448 >> 0x3f;
    uStack_cc0 = uStack_440 >> 0x3f;
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_348 = *plVar29;
    lStack_340 = plVar29[1];
    plVar29 = (long *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    local_358 = *plVar29;
    lStack_350 = plVar29[1];
    local_cd8 = local_348 + local_358;
    uStack_cd0 = lStack_340 + lStack_350;
    puVar27 = (ulong *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar27 = local_cc8 ^ local_cd8;
    puVar27[1] = uStack_cc0 ^ uStack_cd0;
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10 + 8);
    uVar8 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10 + 8);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x10) * 0x10);
    *puVar28 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10 + 0x10);
    puVar28[1] = uVar7;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x18) * 0x10);
    *puVar28 = local_11a8;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    uVar7 = *puVar28;
    uVar8 = puVar28[1];
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    uVar9 = puVar28[1];
    puVar31 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x20) * 0x10);
    *puVar31 = *puVar28;
    puVar31[1] = uVar9;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x28) * 0x10);
    *puVar28 = uVar7;
    puVar28[1] = uVar8;
    local_1188 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10 + 0x10);
    uVar7 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10 + 8);
    uVar9 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10 + 0x10);
    uVar8 = *(undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10 + 8);
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x30) * 0x10);
    *puVar28 = local_11a8;
    puVar28[1] = uVar8;
    puVar28 = (undefined8 *)(local_d00 + (ulong)(local_111c + 0x38) * 0x10);
    *puVar28 = uVar9;
    puVar28[1] = uVar7;
  }
  for (local_111c = 0; local_111c < 0x40; local_111c = local_111c + 1) {
    puVar27 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    uVar10 = puVar27[1];
    uVar11 = local_1118[(ulong)local_111c * 2 + 1];
    puVar30 = (ulong *)(local_d00 + (ulong)local_111c * 0x10);
    *puVar30 = *puVar27 ^ local_1118[(ulong)local_111c * 2];
    puVar30[1] = uVar10 ^ uVar11;
    puVar28 = (undefined8 *)(local_d10 + (ulong)local_111c * 0x10);
    puVar31 = (undefined8 *)(local_d00 + (ulong)local_111c * 0x10);
    uVar7 = puVar31[1];
    *puVar28 = *puVar31;
    puVar28[1] = uVar7;
  }
  return;
}

Assistant:

static void fill_block(__m128i* state, const block* ref_block,
	block* next_block, int with_xor) {
	__m128i block_XY[ARGON2_OWORDS_IN_BLOCK];
	unsigned int i;

	if (with_xor) {
		for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
			state[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)ref_block->v + i));
			block_XY[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)next_block->v + i));
		}
	}
	else {
		for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
			block_XY[i] = state[i] = _mm_xor_si128(
				state[i], _mm_loadu_si128((const __m128i*)ref_block->v + i));
		}
	}

	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND(state[8 * i + 0], state[8 * i + 1], state[8 * i + 2],
			state[8 * i + 3], state[8 * i + 4], state[8 * i + 5],
			state[8 * i + 6], state[8 * i + 7]);
	}

	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND(state[8 * 0 + i], state[8 * 1 + i], state[8 * 2 + i],
			state[8 * 3 + i], state[8 * 4 + i], state[8 * 5 + i],
			state[8 * 6 + i], state[8 * 7 + i]);
	}

	for (i = 0; i < ARGON2_OWORDS_IN_BLOCK; i++) {
		state[i] = _mm_xor_si128(state[i], block_XY[i]);
		_mm_storeu_si128((__m128i*)next_block->v + i, state[i]);
	}
}